

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_compat.c
# Opt level: O1

int SZ_BufftoBuffCompress(void *dest,size_t *destLen,void *source,size_t sourceLen,SZ_com_t *param)

{
  size_t __n;
  uint uVar1;
  int iVar2;
  uint *puVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  void *__ptr;
  void *__ptr_00;
  sbyte sVar7;
  sbyte sVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  uint *__src;
  int iVar12;
  size_t __size;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  size_t sVar17;
  aec_stream strm;
  char zero_pixel [4];
  void *local_2a8;
  void *local_280;
  size_t local_278;
  void *local_268;
  size_t local_260;
  size_t local_258;
  int local_250;
  int local_24c;
  int local_248;
  uint local_244;
  uint local_238 [16];
  undefined4 local_1f8;
  undefined4 local_1b8;
  
  iVar10 = param->pixels_per_block;
  iVar6 = param->pixels_per_scanline;
  iVar4 = (iVar6 + iVar10 + -1) / iVar10;
  uVar1 = param->options_mask;
  uVar16 = 0;
  local_24c = iVar10;
  local_248 = iVar4;
  memset(local_238,0,0x204);
  local_1f8 = 4;
  local_1b8 = 8;
  uVar5 = 1;
  do {
    if ((uVar5 & uVar1) != 0) {
      uVar16 = uVar16 | local_238[(int)uVar5];
    }
    uVar5 = uVar5 * 2;
  } while ((int)uVar5 < 0x81);
  local_244 = uVar16 | 0x40;
  local_260 = *destLen;
  iVar2 = param->bits_per_pixel;
  local_268 = dest;
  if ((iVar2 == 0x40) || (__ptr = source, local_250 = iVar2, iVar2 == 0x20)) {
    local_250 = 8;
    __ptr = malloc(sourceLen);
    if (__ptr == (void *)0x0) {
      iVar10 = -4;
      __ptr = (void *)0x0;
      __ptr_00 = (void *)0x0;
      goto LAB_001014c6;
    }
    iVar12 = iVar2 + 7;
    if (-1 < iVar2) {
      iVar12 = iVar2;
    }
    uVar11 = (ulong)(iVar12 >> 3);
    if (uVar11 <= sourceLen) {
      uVar14 = 0;
      do {
        if (7 < iVar2) {
          uVar13 = 0;
          do {
            *(undefined1 *)((long)__ptr + uVar13 * (sourceLen / uVar11) + uVar14) =
                 *(undefined1 *)((long)source + uVar13);
            uVar13 = uVar13 + 1;
          } while ((uint)(iVar12 >> 3) != uVar13);
        }
        uVar14 = uVar14 + 1;
        source = (void *)((long)source + uVar11);
      } while (uVar14 < sourceLen / uVar11);
    }
  }
  iVar12 = local_250;
  sVar7 = 8 < local_250;
  __n = (ulong)(byte)sVar7 + 1;
  if (0x10 < local_250) {
    sVar7 = 2;
    __n = 4;
  }
  iVar4 = iVar4 * iVar10;
  __size = (ulong)(uint)(iVar4 << sVar7) *
           ((((sourceLen >> sVar7) + (long)iVar6) - 1) / (ulong)(long)iVar6);
  __ptr_00 = malloc(__size);
  if (__ptr_00 == (void *)0x0) {
    iVar10 = -4;
    __ptr_00 = (void *)0x0;
  }
  else {
    sVar7 = 8 < iVar12;
    if (0x10 < iVar12) {
      sVar7 = 2;
    }
    local_238[0] = 0;
    __src = local_238;
    if (sourceLen != 0) {
      sVar8 = 2;
      if (iVar12 < 0x11) {
        sVar8 = 8 < iVar12;
      }
      uVar11 = (ulong)(iVar6 << sVar7);
      sVar17 = (uint)(iVar4 - iVar6 << sVar8) + uVar11;
      uVar14 = 0;
      lVar9 = 0;
      local_2a8 = __ptr_00;
      do {
        uVar13 = sourceLen - uVar14;
        if (uVar11 <= sourceLen - uVar14) {
          uVar13 = uVar11;
        }
        memcpy((void *)((long)__ptr_00 + lVar9),(void *)(uVar14 + (long)__ptr),uVar13);
        uVar14 = uVar14 + uVar13;
        puVar3 = (uint *)((long)__ptr + (uVar14 - __n));
        if ((uVar16 & 8) == 0) {
          puVar3 = __src;
        }
        __src = puVar3;
        if (sVar17 != uVar13) {
          uVar15 = 0;
          do {
            memcpy((void *)((long)local_2a8 + uVar15 + uVar13),__src,__n);
            uVar15 = uVar15 + __n;
          } while (uVar15 < sVar17 - uVar13);
        }
        lVar9 = lVar9 + sVar17;
        local_2a8 = (void *)((long)local_2a8 + sVar17);
      } while (uVar14 < sourceLen);
    }
    local_280 = __ptr_00;
    local_278 = __size;
    iVar6 = aec_buffer_encode(&local_280);
    iVar10 = 2;
    if (iVar6 != -2) {
      iVar10 = iVar6;
    }
    *destLen = local_258;
  }
LAB_001014c6:
  if (__ptr_00 != (void *)0x0) {
    free(__ptr_00);
  }
  if ((iVar2 == 0x20 || iVar2 == 0x40) && __ptr != (void *)0x0) {
    free(__ptr);
  }
  return iVar10;
}

Assistant:

int SZ_BufftoBuffCompress(void *dest, size_t *destLen,
                          const void *source, size_t sourceLen,
                          SZ_com_t *param)
{
    struct aec_stream strm;
    int status;
    int aec_status;
    void *padbuf;
    void *buf;
    size_t padding_size;
    size_t scanlines;
    size_t padbuf_size;
    int pixel_size;
    int interleave;

    strm.block_size = param->pixels_per_block;
    strm.rsi = (param->pixels_per_scanline + param->pixels_per_block - 1)
        / param->pixels_per_block;
    strm.flags = AEC_NOT_ENFORCE | convert_options(param->options_mask);
    strm.avail_out = *destLen;
    strm.next_out = dest;
    buf = 0;
    padbuf = 0;

    interleave = param->bits_per_pixel == 32 || param->bits_per_pixel == 64;
    if (interleave) {
        strm.bits_per_sample = 8;
        buf = malloc(sourceLen);
        if (buf == NULL) {
            status = SZ_MEM_ERROR;
            goto CLEANUP;
        }
        interleave_buffer(buf, source, sourceLen, param->bits_per_pixel / 8);
    } else {
        strm.bits_per_sample = param->bits_per_pixel;
        buf = (void *)source;
    }

    pixel_size = bits_to_bytes(strm.bits_per_sample);

    scanlines = (sourceLen / pixel_size + param->pixels_per_scanline - 1)
        / param->pixels_per_scanline;
    padbuf_size = strm.rsi * strm.block_size * pixel_size * scanlines;
    padbuf = malloc(padbuf_size);
    if (padbuf == NULL) {
        status = SZ_MEM_ERROR;
        goto CLEANUP;
    }

    padding_size =
        (strm.rsi * strm.block_size - param->pixels_per_scanline)
        * pixel_size;

    add_padding(padbuf, buf, sourceLen,
                param->pixels_per_scanline * pixel_size,
                padding_size, pixel_size,
                strm.flags & AEC_DATA_PREPROCESS);
    strm.next_in = padbuf;
    strm.avail_in = padbuf_size;

    aec_status = aec_buffer_encode(&strm);
    if (aec_status == AEC_STREAM_ERROR)
        status = SZ_OUTBUFF_FULL;
    else
        status = aec_status;
    *destLen = strm.total_out;

CLEANUP:
    if (padbuf)
        free(padbuf);
    if (interleave && buf)
        free(buf);
    return status;
}